

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlToSmf.h
# Opt level: O1

Smf * rlib::sequencer::mmlToSmf(Smf *__return_storage_ptr__,string *mml)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  pointer text;
  initializer_list<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>
  __l;
  Track track;
  Result result;
  undefined1 local_139;
  EventMeta *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  Event local_128;
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *local_110;
  Smf *local_108;
  pointer local_100;
  undefined1 local_f8 [16];
  pointer_____offset_0x10___ *local_e8;
  code *local_e0;
  pointer_____offset_0x10___ *local_d8;
  code *local_d0;
  pointer_____offset_0x10___ *local_c8;
  code *local_c0;
  pointer_____offset_0x10___ *local_b8;
  code *local_b0;
  pointer_____offset_0x10___ *local_a8;
  code *local_a0;
  pointer_____offset_0x10___ *local_98;
  code *local_90;
  pointer_____offset_0x10___ *local_88;
  code *local_80;
  _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
  local_78;
  Result local_48;
  
  MmlCompiler::compile(&local_48,mml);
  __return_storage_ptr__->timeBase = 0x1e0;
  local_110 = &__return_storage_ptr__->tracks;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_110;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_110;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  _M_size = 0;
  local_100 = local_48.
              super__Vector_base<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = __return_storage_ptr__;
  if (local_48.
      super__Vector_base<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    text = local_48.
           super__Vector_base<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_78._M_impl.super__Rb_tree_header._M_header;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      midi::EventMeta::createText((EventMeta *)local_f8,sequenceName,&text->name);
      local_138 = (EventMeta *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<rlib::midi::EventMeta,std::allocator<rlib::midi::EventMeta>,rlib::midi::EventMeta>
                (&_Stack_130,&local_138,(allocator<rlib::midi::EventMeta> *)&local_139,
                 (EventMeta *)local_f8);
      _Var1._M_pi = _Stack_130._M_pi;
      local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = &local_138->super_Event;
      local_138 = (EventMeta *)0x0;
      _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128.position = 0;
      local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var1._M_pi;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
        }
      }
      std::
      _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
      ::_M_emplace_equal<rlib::midi::Smf::Event>(&local_78,&local_128);
      if (local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.event.
                   super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      }
      if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
      }
      local_f8._0_8_ = &PTR__EventMeta_0016ac78;
      if (local_e8 != (pointer_____offset_0x10___ *)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      if ((text->instrument)._M_string_length != 0) {
        midi::EventMeta::createText((EventMeta *)local_f8,instrumentName,&text->instrument);
        local_138 = (EventMeta *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<rlib::midi::EventMeta,std::allocator<rlib::midi::EventMeta>,rlib::midi::EventMeta>
                  (&_Stack_130,&local_138,(allocator<rlib::midi::EventMeta> *)&local_139,
                   (EventMeta *)local_f8);
        _Var1._M_pi = _Stack_130._M_pi;
        local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = &local_138->super_Event;
        local_138 = (EventMeta *)0x0;
        _Stack_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_128.position = 0;
        local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var1._M_pi;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
          }
        }
        std::
        _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
        ::_M_emplace_equal<rlib::midi::Smf::Event>(&local_78,&local_128);
        if (local_128.event.super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.event.
                     super___shared_ptr<const_rlib::midi::Event,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
        }
        if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
        }
        local_f8._0_8_ = &PTR__EventMeta_0016ac78;
        if (local_e8 != (pointer_____offset_0x10___ *)0x0) {
          operator_delete(local_e8,(long)local_d8 - (long)local_e8);
        }
      }
      for (p_Var4 = (text->eventList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(text->eventList)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        if ((mmlToSmf(std::__cxx11::string_const&)::map == '\0') &&
           (iVar2 = __cxa_guard_acquire(&mmlToSmf(std::__cxx11::string_const&)::map), iVar2 != 0)) {
          local_f8._0_8_ = &MmlCompiler::EventNote::typeinfo;
          local_f8._8_8_ =
               mmlToSmf(std::__cxx11::string_const&)::
               {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#1}
               ::Event_const__;
          local_e8 = &MmlCompiler::EventProgramChange::typeinfo;
          local_e0 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#2}
                     ::Event_const__;
          local_d8 = &MmlCompiler::EventVolume::typeinfo;
          local_d0 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#3}
                     ::Event_const__;
          local_c8 = &MmlCompiler::EventPan::typeinfo;
          local_c0 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#4}
                     ::Event_const__;
          local_b8 = &MmlCompiler::EventPitchBend::typeinfo;
          local_b0 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#5}
                     ::Event_const__;
          local_a8 = &MmlCompiler::EventControlChange::typeinfo;
          local_a0 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#6}
                     ::Event_const__;
          local_98 = &MmlCompiler::EventTempo::typeinfo;
          local_90 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#7}
                     ::Event_const__;
          local_88 = &MmlCompiler::EventMeta::typeinfo;
          local_80 = mmlToSmf(std::__cxx11::string_const&)::
                     {lambda(rlib::midi::Smf::Track&,rlib::sequencer::MmlCompiler::Port_const&,rlib::sequencer::MmlCompiler::Event_const&)#8}
                     ::Event_const__;
          __l._M_len = 8;
          __l._M_array = (iterator)local_f8;
          std::
          map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
          ::map(&mmlToSmf::map,__l,(less<std::type_index> *)&local_128,(allocator_type *)&local_138)
          ;
          __cxa_atexit(std::
                       map<std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&),_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
                       ::~map,&mmlToSmf::map,&__dso_handle);
          __cxa_guard_release(&mmlToSmf(std::__cxx11::string_const&)::map);
        }
        local_f8._0_8_ = *(undefined8 *)(**(long **)(p_Var4 + 1) + -8);
        cVar3 = std::
                _Rb_tree<std::type_index,_std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>,_std::_Select1st<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_(*)(rlib::midi::Smf::Track_&,_const_rlib::sequencer::MmlCompiler::Port_&,_const_rlib::sequencer::MmlCompiler::Event_&)>_>_>
                ::find(&mmlToSmf::map._M_t,(key_type *)local_f8);
        if ((_Rb_tree_header *)cVar3._M_node != &mmlToSmf::map._M_t._M_impl.super__Rb_tree_header) {
          (*(code *)cVar3._M_node[1]._M_parent)(&local_78,text,*(undefined8 *)(p_Var4 + 1));
        }
      }
      std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_insert<rlib::midi::Smf::Track>(local_110,(iterator)local_110,(Track *)&local_78);
      std::
      _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
      ::~_Rb_tree(&local_78);
      text = text + 1;
    } while (text != local_100);
  }
  std::
  vector<rlib::sequencer::MmlCompiler::Port,_std::allocator<rlib::sequencer::MmlCompiler::Port>_>::
  ~vector(&local_48);
  return local_108;
}

Assistant:

inline midi::Smf mmlToSmf(const std::string& mml) {
		using Smf = midi::Smf;
		const auto result = MmlCompiler::compile(mml);
		Smf smf;
		for (const auto& port : result) {
			Smf::Track track;

			track.events.emplace(Smf::Event(0, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(midi::EventMeta::Type::sequenceName, port.name))));
			if (!port.instrument.empty()) {
				track.events.emplace(Smf::Event(0, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(midi::EventMeta::Type::instrumentName, port.instrument))));
			}

			for (const auto& event : port.eventList) {
				static const std::map<std::type_index, void (*)(Smf::Track&, const MmlCompiler::Port&, const MmlCompiler::Event&)> map = {
					{typeid(MmlCompiler::EventNote), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventNote&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventNoteOn>(port.channel, e.note, e.velocity)));
						track.events.insert(Smf::Event(e.position + e.length, std::make_shared<midi::EventNoteOff>(port.channel, e.note, 0)));
					}},
					{typeid(MmlCompiler::EventProgramChange), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventProgramChange&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventProgramChange>(port.channel, e.programNo)));
					}},
					{typeid(MmlCompiler::EventVolume), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventVolume&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, midi::EventControlChange::Type::volume, e.volume)));
					}},
					{typeid(MmlCompiler::EventPan), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventPan&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, midi::EventControlChange::Type::pan, e.pan)));
					}},
					{typeid(MmlCompiler::EventPitchBend), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventPitchBend&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventPitchBend>(port.channel, e.pitchBend)));
					}},
					{typeid(MmlCompiler::EventControlChange), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventControlChange&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventControlChange>(port.channel, e.no, e.value)));
					}},
					{typeid(MmlCompiler::EventTempo), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventTempo&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventMeta>(midi::EventMeta::createTempo(e.tempo))));
					}},
					{typeid(MmlCompiler::EventMeta), [](Smf::Track& track,const MmlCompiler::Port& port,const MmlCompiler::Event& event) {
						auto& e = static_cast<const MmlCompiler::EventMeta&>(event);
						track.events.insert(Smf::Event(e.position, std::make_shared<midi::EventMeta>(midi::EventMeta::createText(static_cast<midi::EventMeta::Type>(e.type), e.data))));
					}},
				};
				const auto &ev = *event;
				if (auto i = map.find(typeid(ev)); i != map.end()) {
					(i->second)(track, port, *event);
				} else assert(false);
			}
			smf.tracks.emplace_back(std::move(track));
		}

		return smf;
	}